

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

bool __thiscall
Shell::Options::SelectionOptionValue::setValue(SelectionOptionValue *this,string *value)

{
  bool bVar1;
  string *in_RSI;
  long in_RDI;
  int sel;
  bool local_21;
  int local_1c [5];
  
  bVar1 = ::Lib::Int::stringToInt(in_RSI,local_1c);
  if (bVar1) {
    if (((((local_1c[0] == -0x682) || (local_1c[0] + 0x3f3U < 2)) || (local_1c[0] + 0x3ecU < 3)) ||
        (((local_1c[0] == -0x29a || (local_1c[0] + 0x23U < 6)) ||
         ((local_1c[0] + 0x16U < 3 || ((local_1c[0] + 0xbU < 2 || (local_1c[0] + 4U < 9)))))))) ||
       ((local_1c[0] - 10U < 2 ||
        (((((local_1c[0] - 0x14U < 3 || (local_1c[0] - 0x1eU < 6)) || (local_1c[0] == 0x29a)) ||
          ((local_1c[0] - 0x3eaU < 3 || (local_1c[0] - 0x3f2U < 2)))) || (local_1c[0] == 0x682))))))
    {
      *(int *)(in_RDI + 0x98) = local_1c[0];
      local_21 = true;
    }
    else {
      local_21 = false;
    }
  }
  else {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool Options::SelectionOptionValue::setValue(const std::string& value)
{
  int sel;
  if(!Int::stringToInt(value,sel)) return false;
  switch (sel) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 10:
  case 11:
  case 20:
  case 21:
  case 22:

  case 30:
  case 31:
  case 32:
  case 33:
  case 34:
  case 35:

  case 666:

  case 1002:
  case 1003:
  case 1004:
  case 1010:
  case 1011:
  case 1666:
  case -1:
  case -2:
  case -3:
  case -4:
  case -10:
  case -11:
  case -20: // almost same as 20 (but factoring will be on negative and not positive literals)
  case -21:
  case -22:
  case -30: // almost same as 30 (but factoring will be on negative and not positive literals)
  case -31:
  case -32:
  case -33:
  case -34:
  case -35:

  case -666:

  case -1002:
  case -1003:
  case -1004:
  case -1010:
  case -1011: // almost same as 1011 (but factoring will be on negative and not positive literals)
  case -1666:
    actualValue = sel;
    return true;
  default:
    return false;
  }
}